

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_ldst.inc.c
# Opt level: O2

uint64_t address_space_ldq_internal_mips64el
                   (uc_struct_conflict7 *uc,AddressSpace *as,hwaddr addr,MemTxAttrs attrs,
                   MemTxResult *result,device_endian endian)

{
  MemTxResult MVar1;
  MemoryRegion *mr;
  ulong *puVar2;
  uint64_t val;
  hwaddr addr1;
  hwaddr l;
  ulong local_40;
  ram_addr_t local_38;
  hwaddr local_30;
  
  local_30 = 8;
  mr = address_space_translate(as,addr,&local_38,&local_30,false,attrs);
  if ((local_30 < 8) || (mr->ram == false)) {
    MVar1 = memory_region_dispatch_read_mips64el
                      (uc,mr,local_38,&local_40,(uint)(endian == DEVICE_BIG_ENDIAN) * 8 + MO_64,
                       attrs);
  }
  else {
    puVar2 = (ulong *)qemu_map_ram_ptr_mips64el(mr->uc,mr->ram_block,local_38);
    local_40 = *puVar2;
    if (endian == DEVICE_BIG_ENDIAN) {
      local_40 = local_40 >> 0x38 | (local_40 & 0xff000000000000) >> 0x28 |
                 (local_40 & 0xff0000000000) >> 0x18 | (local_40 & 0xff00000000) >> 8 |
                 (local_40 & 0xff000000) << 8 | (local_40 & 0xff0000) << 0x18 |
                 (local_40 & 0xff00) << 0x28 | local_40 << 0x38;
    }
    MVar1 = 0;
  }
  if (result != (MemTxResult *)0x0) {
    *result = MVar1;
  }
  return local_40;
}

Assistant:

static inline uint64_t glue(address_space_ldq_internal, SUFFIX)(struct uc_struct *uc, ARG1_DECL,
    hwaddr addr, MemTxAttrs attrs, MemTxResult *result,
    enum device_endian endian)
{
    uint8_t *ptr;
    uint64_t val;
    MemoryRegion *mr;
    hwaddr l = 8;
    hwaddr addr1;
    MemTxResult r;
    bool release_lock = false;

    //RCU_READ_LOCK();
    mr = TRANSLATE(addr, &addr1, &l, false, attrs);
    if (l < 8 || !memory_access_is_direct(mr, false)) {
        release_lock |= prepare_mmio_access(mr);

        /* I/O case */
        r = memory_region_dispatch_read(uc, mr, addr1, &val,
                                        MO_64 | devend_memop(endian), attrs);
    } else {
        /* RAM case */
        ptr = qemu_map_ram_ptr(mr->uc, mr->ram_block, addr1);
        switch (endian) {
        case DEVICE_LITTLE_ENDIAN:
            val = ldq_le_p(ptr);
            break;
        case DEVICE_BIG_ENDIAN:
            val = ldq_be_p(ptr);
            break;
        default:
            val = ldq_p(ptr);
            break;
        }
        r = MEMTX_OK;
    }
    if (result) {
        *result = r;
    }
    //RCU_READ_UNLOCK();
    return val;
}